

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.cpp
# Opt level: O1

int si9ma::Trie::search(TrieNode *root,string *str)

{
  ulong uVar1;
  char *pcVar2;
  TrieNode *pTVar3;
  ulong uVar4;
  int iVar5;
  TrieNode *cur;
  ulong uVar6;
  bool bVar7;
  
  uVar1 = str->_M_string_length;
  bVar7 = uVar1 != 0;
  if (bVar7) {
    pcVar2 = (str->_M_dataplus)._M_p;
    pTVar3 = *(TrieNode **)((long)root + (long)*pcVar2 * 8 + -0x300);
    if (pTVar3 != (TrieNode *)0x0) {
      uVar4 = 1;
      do {
        uVar6 = uVar4;
        root = pTVar3;
        if (uVar1 == uVar6) break;
        pTVar3 = *(TrieNode **)((long)root + (long)pcVar2[uVar6] * 8 + -0x300);
        uVar4 = uVar6 + 1;
      } while (pTVar3 != (TrieNode *)0x0);
      bVar7 = uVar6 < uVar1;
    }
  }
  iVar5 = 0;
  if (!bVar7) {
    iVar5 = root->end;
  }
  return iVar5;
}

Assistant:

int Trie::search(TrieNode *root,const string &str) {
        auto *cur = root;

        for (int i = 0; i < str.length(); ++i) {
            int index = str[i] - 'a';

            if (cur->nexts[index] == nullptr){
                return 0;
            }
            cur = cur->nexts[index];
        }

        return cur->end;
    }